

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fPolygonOffsetTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Functional::anon_unknown_0::PolygonOffsetTestCase::iterate(PolygonOffsetTestCase *this)

{
  char *__s;
  Context *this_00;
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  RenderTarget *pRVar4;
  NotSupportedError *pNVar5;
  long *plVar6;
  size_type *psVar7;
  GLenum expected;
  GLenum expected_00;
  GLenum expected_01;
  GLuint fboId;
  GLuint colorRboId;
  GLuint depthRboId;
  int local_254;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  long lVar3;
  
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Testing PolygonOffset with ",0x1b);
  __s = this->m_internalFormatName;
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," depth buffer.",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  this_00 = (this->super_TestCase).m_context;
  if (this->m_internalFormat == 0) {
    pRVar4 = Context::getRenderTarget(this_00);
    iVar1 = pRVar4->m_width;
    pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
    local_254 = this->m_targetSize;
    if ((iVar1 < local_254) || (pRVar4->m_height < local_254)) {
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_250,"Render context size must be at least ","");
      de::toString<int>(&local_1d0,&local_254);
      std::operator+(&local_210,&local_250,&local_1d0);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
      local_230._M_dataplus._M_p = (pointer)*plVar6;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_230._M_dataplus._M_p == psVar7) {
        local_230.field_2._M_allocated_capacity = *psVar7;
        local_230.field_2._8_8_ = plVar6[3];
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      }
      else {
        local_230.field_2._M_allocated_capacity = *psVar7;
      }
      local_230._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      de::toString<int>(&local_1f0,&local_254);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                     &local_230,&local_1f0);
      tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)local_1b0);
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
    if (pRVar4->m_depthBits == 0) {
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1b0 = (undefined1  [8])local_1a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"polygon offset tests require depth buffer","");
      tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)local_1b0);
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  }
  else {
    iVar1 = (*this_00->m_renderCtx->_vptr_RenderContext[3])();
    lVar3 = CONCAT44(extraout_var,iVar1);
    local_230._M_dataplus._M_p = (pointer)((ulong)local_230._M_dataplus._M_p._4_4_ << 0x20);
    local_210._M_dataplus._M_p._0_4_ = 0;
    local_250._M_dataplus._M_p = (pointer)((ulong)local_250._M_dataplus._M_p._4_4_ << 0x20);
    (**(code **)(lVar3 + 0x6e8))(1,&local_230);
    (**(code **)(lVar3 + 0xa0))(0x8d41,(ulong)local_230._M_dataplus._M_p & 0xffffffff);
    (**(code **)(lVar3 + 0x1238))(0x8d41,0x8056,this->m_targetSize);
    verifyError((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                *(Functions **)(lVar3 + 0x800),expected);
    (**(code **)(lVar3 + 0x6e8))(1,&local_210);
    (**(code **)(lVar3 + 0xa0))(0x8d41,local_210._M_dataplus._M_p._0_4_);
    (**(code **)(lVar3 + 0x1238))(0x8d41,this->m_internalFormat,this->m_targetSize);
    verifyError((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                *(Functions **)(lVar3 + 0x800),expected_00);
    (**(code **)(lVar3 + 0x6d0))(1,&local_250);
    (**(code **)(lVar3 + 0x78))(0x8d40,(ulong)local_250._M_dataplus._M_p & 0xffffffff);
    (**(code **)(lVar3 + 0x688))
              (0x8d40,0x8ce0,0x8d41,(ulong)local_230._M_dataplus._M_p & 0xffffffff);
    (**(code **)(lVar3 + 0x688))(0x8d40,0x8d00,0x8d41,local_210._M_dataplus._M_p._0_4_);
    verifyError((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                *(Functions **)(lVar3 + 0x800),expected_01);
    iVar1 = (**(code **)(lVar3 + 0x170))(0x8d40);
    if (iVar1 != 0x8cd5) {
      (**(code **)(lVar3 + 0x440))(1,&local_250);
      (**(code **)(lVar3 + 0x460))(1,&local_210);
      (**(code **)(lVar3 + 0x460))(1,&local_230);
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1b0 = (undefined1  [8])local_1a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"could not create fbo for testing.","");
      tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)local_1b0);
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
    (**(code **)(lVar3 + 0x440))(1,&local_250);
    (**(code **)(lVar3 + 0x460))(1,&local_210);
    (**(code **)(lVar3 + 0x460))(1,&local_230);
  }
  return STOP;
}

Assistant:

PolygonOffsetTestCase::IterateResult PolygonOffsetTestCase::iterate (void)
{
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	m_testCtx.getLog() << tcu::TestLog::Message << "Testing PolygonOffset with " << m_internalFormatName << " depth buffer." << tcu::TestLog::EndMessage;

	if (m_internalFormat == 0)
	{
		// default framebuffer
		const int width		= m_context.getRenderTarget().getWidth();
		const int height	= m_context.getRenderTarget().getHeight();

		checkCanvasSize(width, height, m_targetSize, m_targetSize);

		if (m_context.getRenderTarget().getDepthBits() == 0)
			throw tcu::NotSupportedError("polygon offset tests require depth buffer");

		testPolygonOffset();
	}
	else
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		// framebuffer object
		GLuint	colorRboId	= 0;
		GLuint	depthRboId	= 0;
		GLuint	fboId		= 0;
		bool	fboComplete;

		gl.genRenderbuffers(1, &colorRboId);
		gl.bindRenderbuffer(GL_RENDERBUFFER, colorRboId);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA4, m_targetSize, m_targetSize);
		verifyError(m_testCtx, gl, GL_NO_ERROR);

		gl.genRenderbuffers(1, &depthRboId);
		gl.bindRenderbuffer(GL_RENDERBUFFER, depthRboId);
		gl.renderbufferStorage(GL_RENDERBUFFER, m_internalFormat, m_targetSize, m_targetSize);
		verifyError(m_testCtx, gl, GL_NO_ERROR);

		gl.genFramebuffers(1, &fboId);
		gl.bindFramebuffer(GL_FRAMEBUFFER, fboId);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorRboId);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT,	GL_RENDERBUFFER, depthRboId);
		verifyError(m_testCtx, gl, GL_NO_ERROR);

		fboComplete = gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE;

		if (fboComplete)
			testPolygonOffset();

		gl.deleteFramebuffers(1, &fboId);
		gl.deleteRenderbuffers(1, &depthRboId);
		gl.deleteRenderbuffers(1, &colorRboId);

		if (!fboComplete)
			throw tcu::NotSupportedError("could not create fbo for testing.");
	}

	return STOP;
}